

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void * __thiscall
DeviceTy::getTgtPtrBegin
          (DeviceTy *this,void *HstPtrBegin,int64_t Size,bool *IsLast,bool UpdateRefCount)

{
  _List_node_base *p_Var1;
  int iVar2;
  iterator iVar3;
  void *pvVar4;
  LookupResult LVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->DataMapMtx);
  if (iVar2 == 0) {
    LVar5 = lookupMapping(this,HstPtrBegin,Size);
    iVar3 = LVar5.Entry._M_node;
    if (((undefined1  [16])LVar5 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      *IsLast = false;
      pvVar4 = (void *)0x0;
    }
    else {
      p_Var1 = iVar3._M_node[3]._M_next;
      *IsLast = (long)p_Var1 < 2;
      if (UpdateRefCount && 1 < (long)p_Var1) {
        iVar3._M_node[3]._M_next = (_List_node_base *)((long)&p_Var1[-1]._M_prev + 7);
      }
      pvVar4 = (void *)(((long)HstPtrBegin + (long)iVar3._M_node[2]._M_prev) -
                       (long)iVar3._M_node[1]._M_prev);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
    return pvVar4;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void *DeviceTy::getTgtPtrBegin(void *HstPtrBegin, int64_t Size, bool &IsLast,
    bool UpdateRefCount) {
  void *rc = NULL;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);

  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    IsLast = !(HT.RefCount > 1);

    if (HT.RefCount > 1 && UpdateRefCount)
      --HT.RefCount;

    uintptr_t tp = HT.TgtPtrBegin + ((uintptr_t)HstPtrBegin - HT.HstPtrBegin);
    DP("Mapping exists with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD ", "
        "Size=%ld,%s RefCount=%s\n", DPxPTR(HstPtrBegin), DPxPTR(tp), Size,
        (UpdateRefCount ? " updated" : ""),
        (CONSIDERED_INF(HT.RefCount)) ? "INF" :
            std::to_string(HT.RefCount).c_str());
    rc = (void *)tp;
  } else {
    IsLast = false;
  }

  DataMapMtx.unlock();
  return rc;
}